

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out_of_source_main.cpp
# Opt level: O2

bool isRunningInBuildEnvironment(void)

{
  bool bVar1;
  allocator local_109;
  string ending;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  string workingDirectory;
  
  ghc::filesystem::path::path<char[2],ghc::filesystem::path>
            ((path *)&local_e8,(char (*) [2])0x13b051,auto_format);
  ghc::filesystem::canonical((path *)&ending,(path *)&local_e8);
  std::__cxx11::string::string((string *)&workingDirectory,(string *)&ending);
  std::__cxx11::string::~string((string *)&ending);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string((string *)&ending,"examples/out_of_source",(allocator *)&local_e8);
  std::__cxx11::string::string((string *)&local_48,(string *)&ending);
  std::__cxx11::string::string((string *)&local_68,"/",&local_109);
  ApprovalTests::SystemUtils::getDirectorySeparator_abi_cxx11_();
  ApprovalTests::StringUtils::replaceAll(&local_e8,&local_48,&local_68,&local_88);
  std::__cxx11::string::operator=((string *)&ending,(string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_a8,(string *)&workingDirectory);
  std::__cxx11::string::string((string *)&local_c8,(string *)&ending);
  bVar1 = ApprovalTests::StringUtils::endsWith(&local_a8,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&ending);
  std::__cxx11::string::~string((string *)&workingDirectory);
  return bVar1;
}

Assistant:

bool isRunningInBuildEnvironment()
{
    auto workingDirectory = fs::canonical(fs::path(".")).string();
    std::string ending = "examples/out_of_source";
    ending = StringUtils::replaceAll(ending, "/", SystemUtils::getDirectorySeparator());
    return StringUtils::endsWith(workingDirectory, ending);
}